

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

RTPRandom * __thiscall jrtplib::RTPSession::GetRandomNumberGenerator(RTPSession *this,RTPRandom *r)

{
  bool bVar1;
  
  bVar1 = r == (RTPRandom *)0x0;
  if (bVar1) {
    r = RTPRandom::CreateDefaultRandomNumberGenerator();
  }
  this->deletertprnd = bVar1;
  return r;
}

Assistant:

RTPRandom *RTPSession::GetRandomNumberGenerator(RTPRandom *r)
{
	RTPRandom *rnew = 0;

	if (r == 0)
	{
		rnew = RTPRandom::CreateDefaultRandomNumberGenerator();
		deletertprnd = true;
	}
	else
	{
		rnew = r;
		deletertprnd = false;
	}

	return rnew;
}